

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_rkv_reg.c
# Opt level: O3

MPP_RET rkv_h264d_gen_regs(void *hal,HalTaskInfo *task)

{
  ushort uVar1;
  RK_U64 *pRVar2;
  ushort *puVar3;
  void *__s;
  int iVar4;
  uint uVar5;
  RK_U32 RVar6;
  RK_U32 RVar7;
  uint uVar8;
  RK_U64 *pRVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 *puVar12;
  long lVar13;
  ulong uVar14;
  size_t offset;
  bool bVar15;
  RK_U64 RVar16;
  byte bVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  RK_U64 RVar21;
  long lVar22;
  bool bVar23;
  BitputCtx_t bp;
  uint local_78;
  MppFrame local_70 [4];
  RK_U64 *local_50;
  RK_U64 *local_48;
  RK_U64 *local_40;
  HalTaskInfo *local_38;
  
  if (hal == (void *)0x0) {
    if (((byte)hal_h264d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264d_rkv_reg","input empty(%d).\n",(char *)0x0,0x278);
    }
  }
  else if ((((task->dec).flags.val & 4) == 0) &&
          ((((task->dec).flags.val & 8) == 0 || (*(int *)(*(long *)((long)hal + 0x60) + 0x30) != 0))
          )) {
    pRVar2 = *(RK_U64 **)((long)hal + 0x90);
    if (*(int *)((long)hal + 0x98) != 0) {
      pRVar9 = pRVar2 + 0x52;
      lVar13 = 0;
      do {
        if ((int)*pRVar9 == 0) {
          (task->dec).reg_index = (RK_S32)lVar13;
          RVar16 = pRVar9[2];
          pRVar2[0x61] = pRVar9[1];
          pRVar2[0x62] = RVar16;
          RVar16 = pRVar9[4];
          pRVar2[99] = pRVar9[3];
          pRVar2[100] = RVar16;
          *(int *)pRVar9 = 1;
          break;
        }
        lVar13 = lVar13 + 1;
        pRVar9 = pRVar9 + 5;
      } while (lVar13 != 3);
    }
    puVar3 = *(ushort **)((long)hal + 8);
    local_38 = task;
    mpp_set_bitput_ctx((BitputCtx_t *)local_70,pRVar2,0x20);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,4);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,8);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 4 & 3),2);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[4],3);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 9),3);
    RVar16 = 0;
    mpp_put_bits((BitputCtx_t *)local_70,0,1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x7c],4);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 5),5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0xf9),2);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x7d],4);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0xfb),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*puVar3 + 1,9);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)puVar3[1] + 1,9);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 0xc & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 1 & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x7e],1);
    mpp_put_bits((BitputCtx_t *)local_70,1,1);
    mpp_put_bits((BitputCtx_t *)local_70,(long)(char)puVar3[0x83] + 1,2);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)puVar3[0x84],10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)puVar3[0x85],10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x94],1);
    if ((char)puVar3[0x94] != '\0') {
      RVar16 = (RK_U64)puVar3[0x9c];
    }
    mpp_put_bits((BitputCtx_t *)local_70,RVar16,10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x19c],1);
    if ((char)puVar3[0x19c] == '\0') {
      RVar16 = 0;
    }
    else {
      RVar16 = (RK_U64)puVar3[0x1a4];
    }
    mpp_put_bits((BitputCtx_t *)local_70,RVar16,10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x2a4],1);
    if ((char)puVar3[0x2a4] == '\0') {
      RVar16 = 0;
    }
    else {
      RVar16 = (RK_U64)puVar3[0x2ac];
    }
    mpp_put_bits((BitputCtx_t *)local_70,RVar16,10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x3ac],1);
    if ((char)puVar3[0x3ac] == '\0') {
      RVar16 = 0;
    }
    else {
      RVar16 = (RK_U64)puVar3[0x3b4];
    }
    mpp_put_bits((BitputCtx_t *)local_70,RVar16,10);
    mpp_put_align((BitputCtx_t *)local_70,0x20,0);
    lVar13 = *(long *)((long)hal + 0x90);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,8);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0xfd),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x7f],1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0xad),5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x57],5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(*(byte *)((long)puVar3 + 7) & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 9 & 3),2);
    mpp_put_bits((BitputCtx_t *)local_70,(long)(char)puVar3[0x56],7);
    mpp_put_bits((BitputCtx_t *)local_70,(long)(char)puVar3[0x54],6);
    mpp_put_bits((BitputCtx_t *)local_70,(long)*(char *)((long)puVar3 + 0xa9),5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0x101),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 7 & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x81],1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 0xd & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(long)(char)puVar3[0x55],5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x4d1],1);
    iVar4 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar13 + 0x318),"prepare_spspps");
    mpp_put_bits((BitputCtx_t *)local_70,(long)iVar4,0x20);
    lVar13 = 0;
    do {
      bVar17 = *(byte *)((long)puVar3 + lVar13 + 0x10);
      uVar5 = (uint)(bVar17 >> 7);
      if (bVar17 == 0xff) {
        uVar5 = 0;
      }
      mpp_put_bits((BitputCtx_t *)local_70,(ulong)uVar5,1);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    lVar13 = 0;
    do {
      if (*(char *)((long)puVar3 + lVar13 + 0x10) == -1) {
        RVar16 = 0;
      }
      else {
        RVar16 = (RK_U64)*(byte *)((long)puVar3 + lVar13 + 0x992);
      }
      mpp_put_bits((BitputCtx_t *)local_70,RVar16,1);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    lVar20 = 0;
    mpp_put_align((BitputCtx_t *)local_70,0x40,0);
    local_40 = pRVar2 + 4;
    lVar13 = *(long *)((long)hal + 8);
    mpp_set_bitput_ctx((BitputCtx_t *)local_70,local_40,0x100);
    bVar17 = *(byte *)(lVar13 + 0xf8);
    do {
      if ((*(ushort *)(lVar13 + 0xf4) >> ((uint)lVar20 & 0x1f) & 1) == 0) {
        uVar1 = *(ushort *)(lVar13 + 0xb0 + lVar20 * 2);
        uVar5 = (uint)uVar1;
        if (-1 < *(char *)(lVar13 + 0x10 + lVar20)) {
          iVar4 = -0x10 << (bVar17 & 0x1f);
          if (uVar1 <= *(ushort *)(lVar13 + 0xf6)) {
            iVar4 = 0;
          }
          uVar5 = uVar5 + iVar4;
        }
      }
      else {
        uVar5 = 0;
      }
      mpp_put_bits((BitputCtx_t *)local_70,(ulong)(uVar5 & 0xffff),0x10);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10);
    iVar4 = 0x10;
    do {
      mpp_put_bits((BitputCtx_t *)local_70,0,1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    lVar20 = 0;
    local_48 = pRVar2;
    do {
      mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)(lVar13 + 0x992 + lVar20),1);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10);
    lVar20 = 0;
    do {
      bVar17 = *(byte *)(*(long *)((long)hal + 0x28) + 0x11 + lVar20);
      if (bVar17 == 0xff) {
        RVar21 = 0;
        uVar10 = 0;
        RVar16 = 0;
        uVar11 = 0;
      }
      else {
        RVar21 = (RK_U64)(bVar17 >> 7);
        RVar16 = (RK_U64)*(byte *)(lVar13 + 0x992 + (ulong)(bVar17 & 0x7f));
        uVar10 = 0x10;
        uVar11 = (ulong)(bVar17 & 0x7f);
      }
      mpp_put_bits((BitputCtx_t *)local_70,uVar11 | uVar10,5);
      mpp_put_bits((BitputCtx_t *)local_70,RVar21,1);
      mpp_put_bits((BitputCtx_t *)local_70,RVar16,1);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x20);
    lVar20 = 1;
    lVar22 = 0x31;
    do {
      lVar19 = 0;
      local_50 = (RK_U64 *)lVar20;
      do {
        bVar17 = *(byte *)(lVar19 + *(long *)((long)hal + 0x28) + lVar22);
        uVar5 = bVar17 & 0x7f;
        if (bVar17 == 0xff) {
          uVar5 = 0;
        }
        if (bVar17 == 0xff) {
          RVar21 = 0;
          uVar11 = 0;
          RVar16 = 0;
        }
        else {
          RVar21 = (RK_U64)(bVar17 >> 7);
          RVar16 = (RK_U64)*(byte *)(lVar13 + 0x992 + (ulong)(bVar17 & 0x7f));
          uVar11 = 0x10;
        }
        mpp_put_bits((BitputCtx_t *)local_70,uVar5 | uVar11,5);
        mpp_put_bits((BitputCtx_t *)local_70,RVar21,1);
        mpp_put_bits((BitputCtx_t *)local_70,RVar16,1);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x20);
      lVar20 = (long)local_50 + 1;
      lVar22 = lVar22 + 0x20;
    } while (lVar20 != 3);
    mpp_put_align((BitputCtx_t *)local_70,0x80,0);
    local_50 = local_48 + 0x24;
    lVar13 = *(long *)((long)hal + 8);
    if (*(char *)(lVar13 + 0x9a2) != '\0') {
      mpp_set_bitput_ctx((BitputCtx_t *)local_70,local_50,0x160);
      lVar13 = 0;
      lVar20 = 0;
      do {
        lVar22 = 0;
        do {
          mpp_put_bits((BitputCtx_t *)local_70,
                       (ulong)*(byte *)(lVar22 + *(long *)((long)hal + 0x10) + lVar13),8);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0x10);
        lVar20 = lVar20 + 1;
        lVar13 = lVar13 + 0x10;
      } while (lVar20 != 6);
      lVar13 = 0;
      bVar23 = true;
      do {
        bVar15 = bVar23;
        lVar20 = 0;
        do {
          mpp_put_bits((BitputCtx_t *)local_70,
                       (ulong)*(byte *)(lVar20 + 0x60 + *(long *)((long)hal + 0x10) + lVar13 * 0x40)
                       ,8);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x40);
        lVar13 = 1;
        bVar23 = false;
      } while (bVar15);
      lVar13 = *(long *)((long)hal + 8);
    }
    __s = (void *)local_48[100];
    bVar17 = 0;
    memset(__s,0,0x140);
    *(undefined4 *)((long)__s + 8) = 0x100000;
    *(uint *)((long)__s + 0x14) = *(uint *)((long)hal + 0x38) & 0x7ffffff;
    *(undefined4 *)((long)__s + 0xc) = 0xffe00800;
    local_70[0] = (MppFrame)0x0;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x50),*(byte *)(lVar13 + 4) & 0x7f,SLOT_FRAME_PTR,
               local_70);
    RVar6 = mpp_frame_get_hor_stride(local_70[0]);
    RVar7 = mpp_frame_get_ver_stride(local_70[0]);
    uVar8 = RVar7 * RVar6;
    uVar5 = uVar8;
    switch(*(ushort *)(lVar13 + 6) >> 4 & 3) {
    case 1:
      uVar5 = (uVar8 >> 1) + uVar8;
      break;
    case 2:
      uVar5 = uVar8 * 2;
      break;
    case 3:
      uVar5 = 0;
    }
    uVar18 = RVar6 >> 4 & 0x1ff;
    *(uint *)((long)__s + 0xc) = uVar18 << 0xc | *(uint *)((long)__s + 0xc) & 0xffe00e00 | uVar18;
    *(ulong *)((long)__s + 0x20) =
         *(ulong *)((long)__s + 0x20) & (ulong)DAT_0029c8c0 |
         CONCAT44(uVar5 >> 4,uVar8 >> 4) & (ulong)DAT_0029c8b0;
    local_70[0] = (MppBuffer)0x0;
    *(undefined4 *)((long)__s + 0xa0) = *(undefined4 *)(lVar13 + 0x20);
    *(undefined4 *)((long)__s + 0x128) = *(undefined4 *)(lVar13 + 0x24);
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x50),*(byte *)(lVar13 + 4) & 0x7f,SLOT_BUFFER,local_70)
    ;
    iVar4 = mpp_buffer_get_fd_with_caller(local_70[0],"set_registers");
    *(int *)((long)__s + 0x1c) = iVar4;
    local_70[0] = (MppBuffer)0x0;
    local_78 = 0xffffffff;
    uVar11 = 0;
    do {
      uVar5 = (uint)uVar11;
      uVar10 = uVar11 >> 1 & 0x7fffffff;
      uVar14 = (ulong)(uVar5 + 0xf >> 1);
      bVar23 = (uVar11 & 1) == 0;
      puVar12 = (undefined4 *)(lVar13 + 0x2c + uVar10 * 8);
      if (bVar23) {
        puVar12 = (undefined4 *)(lVar13 + 0x28 + uVar10 * 8);
      }
      *(undefined4 *)((long)__s + uVar11 * 4 + 100) = *puVar12;
      puVar12 = (undefined4 *)(lVar13 + 0x2c + uVar14 * 8);
      if (!bVar23) {
        puVar12 = (undefined4 *)(lVar13 + 0x28 + uVar14 * 8);
      }
      *(undefined4 *)((long)__s + uVar11 * 4 + 0xc4) = *puVar12;
      mpp_dev_set_reg_offset
                (*(MppDev *)((long)hal + 0x88),uVar5 + 10,
                 (uint)((*(ushort *)(lVar13 + 0x990) >> (uVar5 & 0x1f) & 1) != 0) +
                 (*(uint *)(lVar13 + 0xf0) >> (bVar17 & 0x1f) & 1) * 2 +
                 (*(uint *)(lVar13 + 0xf0) >> (bVar17 + 1 & 0x1f) & 1) * 4 +
                 (*(ushort *)(lVar13 + 0x98e) >> ((byte)uVar11 & 0x1f) & 1) * 8);
      uVar5 = (uint)*(byte *)(lVar13 + 0x10 + uVar11);
      if (uVar5 == 0xff) {
        uVar5 = local_78;
        if ((int)local_78 < 0) {
          uVar5 = *(byte *)(lVar13 + 4) & 0x7f;
        }
      }
      else {
        local_78 = uVar5 & 0x7f;
        uVar5 = local_78;
      }
      mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x50),uVar5,SLOT_BUFFER,local_70);
      iVar4 = mpp_buffer_get_fd_with_caller(local_70[0],"set_registers");
      *(int *)((long)__s + uVar11 * 4 + 0x28) = iVar4;
      uVar11 = uVar11 + 1;
      bVar17 = bVar17 + 2;
    } while (uVar11 != 0xf);
    *(undefined4 *)((long)__s + 0x120) = *(undefined4 *)(lVar13 + 0xa0);
    *(undefined4 *)((long)__s + 0x124) = *(undefined4 *)(lVar13 + 0xa4);
    mpp_dev_set_reg_offset
              (*(MppDev *)((long)hal + 0x88),0x30,
               *(ushort *)(lVar13 + 0x98e) >> 0xc & 8 |
               (uint)(*(ushort *)(lVar13 + 0x990) >> 0xf) + (*(uint *)(lVar13 + 0xf0) >> 0x1e) * 2);
    if (*(byte *)(lVar13 + 0x1f) == 0xff) {
      if ((int)local_78 < 0) {
        local_78 = *(byte *)(lVar13 + 4) & 0x7f;
      }
    }
    else {
      local_78 = *(byte *)(lVar13 + 0x1f) & 0x7f;
    }
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x50),local_78,SLOT_BUFFER,local_70);
    iVar4 = mpp_buffer_get_fd_with_caller(local_70[0],"set_registers");
    *(int *)((long)__s + 0xc0) = iVar4;
    local_70[0] = (MppBuffer)0x0;
    lVar13 = *(long *)((long)hal + 0x90);
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x58),(local_38->dec).input,SLOT_BUFFER,local_70);
    iVar4 = mpp_buffer_get_fd_with_caller(local_70[0],"set_registers");
    *(int *)((long)__s + 0x10) = iVar4;
    iVar4 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar13 + 0x280),"set_registers");
    pRVar2 = local_48;
    *(int *)((long)__s + 0x18) = iVar4;
    *(undefined4 *)((long)__s + 0xa4) = *(undefined4 *)((long)__s + 0x10);
    offset = 0;
    do {
      mpp_buffer_write_with_caller((MppBuffer)pRVar2[0x61],offset,pRVar2,0x20,"rkv_h264d_gen_regs");
      offset = offset + 0x20;
    } while (offset != 0x2000);
    iVar4 = mpp_buffer_get_fd_with_caller((MppBuffer)pRVar2[0x61],"rkv_h264d_gen_regs");
    *(int *)(pRVar2[100] + 0xa8) = iVar4;
    mpp_buffer_write_with_caller((MppBuffer)pRVar2[0x62],0,local_40,0x100,"rkv_h264d_gen_regs");
    iVar4 = mpp_buffer_get_fd_with_caller((MppBuffer)pRVar2[0x62],"rkv_h264d_gen_regs");
    *(int *)(pRVar2[100] + 0xac) = iVar4;
    mpp_buffer_write_with_caller((MppBuffer)pRVar2[99],0,local_50,0x160,"rkv_h264d_gen_regs");
    iVar4 = mpp_buffer_get_fd_with_caller((MppBuffer)pRVar2[0x51],"rkv_h264d_gen_regs");
    *(int *)(pRVar2[100] + 300) = iVar4;
    mpp_buffer_sync_end_f((MppBuffer)pRVar2[0x61],0,"rkv_h264d_gen_regs");
    mpp_buffer_sync_end_f((MppBuffer)pRVar2[0x62],0,"rkv_h264d_gen_regs");
    mpp_buffer_sync_end_f((MppBuffer)pRVar2[99],0,"rkv_h264d_gen_regs");
  }
  return MPP_OK;
}

Assistant:

MPP_RET rkv_h264d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !p_hal->cfg->base.disable_error)) {
        goto __RETURN;
    }
    H264dRkvRegCtx_t *reg_ctx = (H264dRkvRegCtx_t *)p_hal->reg_ctx;
    if (p_hal->fast_mode) {
        RK_U32 i = 0;
        for (i = 0; i <  MPP_ARRAY_ELEMS(reg_ctx->reg_buf); i++) {
            if (!reg_ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                reg_ctx->spspps_buf = reg_ctx->reg_buf[i].spspps;
                reg_ctx->rps_buf = reg_ctx->reg_buf[i].rps;
                reg_ctx->sclst_buf = reg_ctx->reg_buf[i].sclst;
                reg_ctx->regs = reg_ctx->reg_buf[i].regs;
                reg_ctx->reg_buf[i].valid = 1;
                break;
            }
        }
    }

    prepare_spspps(p_hal, (RK_U64 *)&reg_ctx->spspps, sizeof(reg_ctx->spspps));
    prepare_framerps(p_hal, (RK_U64 *)&reg_ctx->rps, sizeof(reg_ctx->rps));
    prepare_scanlist(p_hal, (RK_U64 *)&reg_ctx->sclst, sizeof(reg_ctx->sclst));
    set_registers(p_hal, reg_ctx->regs, task);

    //!< copy datas
    RK_U32 i = 0;
    for (i = 0; i < 256; i++) {
        mpp_buffer_write(reg_ctx->spspps_buf,
                         (sizeof(reg_ctx->spspps) * i), (void *)reg_ctx->spspps,
                         sizeof(reg_ctx->spspps));
    }
    reg_ctx->regs->sw42.pps_base = mpp_buffer_get_fd(reg_ctx->spspps_buf);

    mpp_buffer_write(reg_ctx->rps_buf, 0,
                     (void *)reg_ctx->rps, sizeof(reg_ctx->rps));
    reg_ctx->regs->sw43.rps_base = mpp_buffer_get_fd(reg_ctx->rps_buf);

    mpp_buffer_write(reg_ctx->sclst_buf, 0,
                     (void *)reg_ctx->sclst, sizeof(reg_ctx->sclst));
    reg_ctx->regs->sw75.errorinfo_base = mpp_buffer_get_fd(reg_ctx->errinfo_buf);
    mpp_buffer_sync_end(reg_ctx->spspps_buf);
    mpp_buffer_sync_end(reg_ctx->rps_buf);
    mpp_buffer_sync_end(reg_ctx->sclst_buf);

__RETURN:
    return ret = MPP_OK;
}